

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O3

QIconEngine * __thiscall QIconLoader::iconEngine(QIconLoader *this,QString *iconName)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  qsizetype qVar3;
  int *piVar4;
  QPlatformTheme *pQVar5;
  QDebug this_00;
  undefined8 uVar6;
  byte bVar7;
  char cVar8;
  int iVar9;
  QString *pQVar10;
  QHash<QAbstractFileIconProvider::IconType,_QIcon> *pQVar11;
  QIconEnginePlugin *pQVar12;
  QFontIconEngine *this_01;
  QFontIconEngine *pQVar13;
  undefined4 extraout_var;
  char16_t *pcVar14;
  pointer __old_p;
  pointer __old_p_1;
  long in_FS_OFFSET;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QIconEngine local_98;
  undefined1 local_90 [8];
  QDebug local_88;
  QArrayDataPointer<QString> local_80;
  char *local_68;
  QArrayData *local_60 [3];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_80.d._0_4_ = 2;
    local_80.d._4_4_ = 0;
    local_80.ptr._0_4_ = 0;
    local_80.ptr._4_4_ = 0;
    local_80.size._0_4_ = 0;
    local_80.size._4_4_ = 0;
    local_68 = lcIconLoader::category.name;
    QMessageLogger::debug();
    uVar6 = local_48._0_8_;
    QVar15.m_data = (storage_type *)0x1e;
    QVar15.m_size = (qsizetype)local_60;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<((QTextStream *)uVar6,(QString *)local_60);
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
    pcVar14 = (iconName->d).ptr;
    if (pcVar14 == (char16_t *)0x0) {
      pcVar14 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)local_48,(ulong)pcVar14);
    if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
    QDebug::~QDebug((QDebug *)local_48);
  }
  bVar7 = (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
          super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged;
  if ((bool)bVar7 == false) {
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_80.d._0_4_ = 2;
      local_80.d._4_4_ = 0;
      local_80.ptr._0_4_ = 0;
      local_80.ptr._4_4_ = 0;
      local_80.size._0_4_ = 0;
      local_80.size._4_4_ = 0;
      local_68 = lcIconLoader::category.name;
      QMessageLogger::debug();
      uVar6 = local_48._0_8_;
      QVar16.m_data = (storage_type *)0x1a;
      QVar16.m_size = (qsizetype)local_60;
      QString::fromUtf8(QVar16);
      QTextStream::operator<<((QTextStream *)uVar6,(QString *)local_60);
      if (local_60[0] != (QArrayData *)0x0) {
        LOCK();
        (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_60[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
      }
      pQVar10 = &this->m_userTheme;
      if ((this->m_userTheme).d.size == 0) {
        pQVar10 = &this->m_systemTheme;
      }
      pQVar1 = &((pQVar10->d).d)->super_QArrayData;
      pcVar14 = (pQVar10->d).ptr;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (pcVar14 == (char16_t *)0x0) {
        pcVar14 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)local_48,(ulong)pcVar14);
      if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
      }
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      QDebug::~QDebug((QDebug *)local_48);
    }
    pQVar11 = qt_iconEngineFactoryLoader();
    pQVar10 = &this->m_userTheme;
    if ((this->m_userTheme).d.size == 0) {
      pQVar10 = &this->m_systemTheme;
    }
    pDVar2 = (pQVar10->d).d;
    local_80.d._0_4_ = SUB84(pDVar2,0);
    local_80.d._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
    pcVar14 = (pQVar10->d).ptr;
    local_80.ptr._0_4_ = SUB84(pcVar14,0);
    local_80.ptr._4_4_ = (undefined4)((ulong)pcVar14 >> 0x20);
    qVar3 = (pQVar10->d).size;
    local_80.size._0_4_ = (undefined4)qVar3;
    local_80.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    iVar9 = QFactoryLoader::indexOf((QString *)pQVar11);
    piVar4 = (int *)CONCAT44(local_80.d._4_4_,local_80.d._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_80.d._4_4_,local_80.d._0_4_),2,0x10);
      }
    }
    if (iVar9 < 0) {
      bVar7 = (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
              super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged;
      goto LAB_0027c080;
    }
    pQVar11 = qt_iconEngineFactoryLoader();
    QFactoryLoader::instance((int)pQVar11);
    pQVar12 = (QIconEnginePlugin *)
              QMetaObject::cast((QObject *)&QIconEnginePlugin::staticMetaObject);
    (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
    super__Optional_payload_base<QIconEnginePlugin_*>._M_payload._M_value = pQVar12;
    (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
    super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged = true;
LAB_0027c088:
    if (pQVar12 == (QIconEnginePlugin *)0x0) goto LAB_0027c09b;
    this_01 = (QFontIconEngine *)(**(code **)(*(long *)pQVar12 + 0x60))();
  }
  else {
LAB_0027c080:
    if ((bVar7 & 1) != 0) {
      pQVar12 = (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
                super__Optional_payload_base<QIconEnginePlugin_*>._M_payload._M_value;
      goto LAB_0027c088;
    }
LAB_0027c09b:
    this_01 = (QFontIconEngine *)0x0;
  }
  if ((this->m_userTheme).d.size == 0) {
    if (this_01 != (QFontIconEngine *)0x0) goto LAB_0027c3c6;
    this_01 = (QFontIconEngine *)0x0;
  }
  else {
    if ((this_01 == (QFontIconEngine *)0x0) ||
       (iVar9 = (*(this_01->super_QIconEngine)._vptr_QIconEngine[0xd])(this_01), (char)iVar9 != '\0'
       )) {
      QFontDatabase::families((QStringList *)&local_80,Any);
      pQVar10 = &this->m_userTheme;
      if ((this->m_userTheme).d.size == 0) {
        pQVar10 = &this->m_systemTheme;
      }
      pQVar1 = &((pQVar10->d).d)->super_QArrayData;
      pcVar14 = (pQVar10->d).ptr;
      qVar3 = (pQVar10->d).size;
      if (pQVar1 == (QArrayData *)0x0) {
        QVar24.m_data = pcVar14;
        QVar24.m_size = qVar3;
        cVar8 = QtPrivate::QStringList_contains((QList_conflict *)&local_80,QVar24,CaseSensitive);
      }
      else {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        QVar23.m_data = pcVar14;
        QVar23.m_size = qVar3;
        cVar8 = QtPrivate::QStringList_contains((QList_conflict *)&local_80,QVar23,CaseSensitive);
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_80);
      if (cVar8 != '\0') {
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pQVar10 = &this->m_userTheme;
        if ((this->m_userTheme).d.size == 0) {
          pQVar10 = &this->m_systemTheme;
        }
        pDVar2 = (pQVar10->d).d;
        local_80.d._0_4_ = SUB84(pDVar2,0);
        local_80.d._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
        pcVar14 = (pQVar10->d).ptr;
        local_80.ptr._0_4_ = SUB84(pcVar14,0);
        local_80.ptr._4_4_ = (undefined4)((ulong)pcVar14 >> 0x20);
        qVar3 = (pQVar10->d).size;
        local_80.size._0_4_ = (undefined4)qVar3;
        local_80.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QFont::QFont((QFont *)local_48,(QString *)&local_80,-1,-1,false);
        piVar4 = (int *)CONCAT44(local_80.d._4_4_,local_80.d._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_80.d._4_4_,local_80.d._0_4_),2,0x10)
            ;
          }
        }
        QFont::setStyleStrategy((QFont *)local_48,NoFontMerging);
        lcIconLoader();
        if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
           ) {
          local_80.d._0_4_ = 2;
          local_80.d._4_4_ = 0;
          local_80.ptr._0_4_ = 0;
          local_80.ptr._4_4_ = 0;
          local_80.size._0_4_ = 0;
          local_80.size._4_4_ = 0;
          local_68 = lcIconLoader::category.name;
          QMessageLogger::debug();
          this_00.stream = local_88.stream;
          QVar17.m_data = (storage_type *)0x18;
          QVar17.m_size = (qsizetype)local_60;
          QString::fromUtf8(QVar17);
          QTextStream::operator<<(&(this_00.stream)->ts,(QString *)local_60);
          if (local_60[0] != (QArrayData *)0x0) {
            LOCK();
            (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_60[0],2,0x10);
            }
          }
          if ((local_88.stream)->space == true) {
            QTextStream::operator<<(&(local_88.stream)->ts,' ');
          }
          QDebug::~QDebug(&local_88);
        }
        pQVar13 = (QFontIconEngine *)operator_new(0x58);
        QFontIconEngine::QFontIconEngine(pQVar13,iconName,(QFont *)local_48);
        if (this_01 != (QFontIconEngine *)0x0) {
          (*(this_01->super_QIconEngine)._vptr_QIconEngine[1])(this_01);
        }
        QFont::~QFont((QFont *)local_48);
        this_01 = pQVar13;
        goto LAB_0027c2dc;
      }
      if (this_01 != (QFontIconEngine *)0x0) goto LAB_0027c2dc;
      pQVar13 = (QFontIconEngine *)0x0;
    }
    else {
LAB_0027c2dc:
      iVar9 = (*(this_01->super_QIconEngine)._vptr_QIconEngine[0xd])(this_01);
      pQVar13 = this_01;
      if ((char)iVar9 == '\0') goto LAB_0027c3c6;
    }
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_80.d._0_4_ = 2;
      local_80.d._4_4_ = 0;
      local_80.ptr._0_4_ = 0;
      local_80.ptr._4_4_ = 0;
      local_80.size._0_4_ = 0;
      local_80.size._4_4_ = 0;
      local_68 = lcIconLoader::category.name;
      QMessageLogger::debug();
      uVar6 = local_48._0_8_;
      QVar18.m_data = (storage_type *)0x1f;
      QVar18.m_size = (qsizetype)local_60;
      QString::fromUtf8(QVar18);
      QTextStream::operator<<((QTextStream *)uVar6,(QString *)local_60);
      if (local_60[0] != (QArrayData *)0x0) {
        LOCK();
        (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_60[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
      }
      QDebug::~QDebug((QDebug *)local_48);
    }
    this_01 = (QFontIconEngine *)operator_new(0x50);
    QIconLoaderEngine::QIconLoaderEngine((QIconLoaderEngine *)this_01,iconName);
    if (pQVar13 != (QFontIconEngine *)0x0) {
      (*(pQVar13->super_QIconEngine)._vptr_QIconEngine[1])(pQVar13);
    }
LAB_0027c3c6:
    iVar9 = (*(this_01->super_QIconEngine)._vptr_QIconEngine[0xd])(this_01);
    pQVar13 = this_01;
    if ((char)iVar9 == '\0') goto LAB_0027c64f;
  }
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_80.d._0_4_ = 2;
    local_80.d._4_4_ = 0;
    local_80.ptr._0_4_ = 0;
    local_80.ptr._4_4_ = 0;
    local_80.size._0_4_ = 0;
    local_80.size._4_4_ = 0;
    local_68 = lcIconLoader::category.name;
    QMessageLogger::debug();
    uVar6 = local_48._0_8_;
    QVar19.m_data = (storage_type *)0x33;
    QVar19.m_size = (qsizetype)local_60;
    QString::fromUtf8(QVar19);
    QTextStream::operator<<((QTextStream *)uVar6,(QString *)local_60);
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
    QDebug::~QDebug((QDebug *)local_48);
  }
  pQVar5 = QGuiApplicationPrivate::platform_theme;
  if (QGuiApplicationPrivate::platform_theme != (QPlatformTheme *)0x0) {
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_80.d._0_4_ = 2;
      local_80.d._4_4_ = 0;
      local_80.ptr._0_4_ = 0;
      local_80.ptr._4_4_ = 0;
      local_80.size._0_4_ = 0;
      local_80.size._4_4_ = 0;
      local_68 = lcIconLoader::category.name;
      QMessageLogger::debug();
      uVar6 = local_48._0_8_;
      QVar20.m_data = (storage_type *)0x17;
      QVar20.m_size = (qsizetype)local_60;
      QString::fromUtf8(QVar20);
      QTextStream::operator<<((QTextStream *)uVar6,(QString *)local_60);
      if (local_60[0] != (QArrayData *)0x0) {
        LOCK();
        (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_60[0],2,0x10);
        }
      }
      if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
      }
      QDebug::~QDebug((QDebug *)local_48);
    }
    iVar9 = (*pQVar5->_vptr_QPlatformTheme[0xf])(pQVar5,iconName);
    pQVar13 = (QFontIconEngine *)CONCAT44(extraout_var,iVar9);
    if (pQVar13 != (QFontIconEngine *)0x0) {
      iVar9 = (*(pQVar13->super_QIconEngine)._vptr_QIconEngine[0xd])(pQVar13);
      if ((char)iVar9 == '\0') {
        if (this_01 != (QFontIconEngine *)0x0) {
          (*(this_01->super_QIconEngine)._vptr_QIconEngine[1])(this_01);
        }
        lcIconLoader();
        if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
           ) {
          local_80.d._0_4_ = 2;
          local_80.d._4_4_ = 0;
          local_80.ptr._0_4_ = 0;
          local_80.ptr._4_4_ = 0;
          local_80.size._0_4_ = 0;
          local_80.size._4_4_ = 0;
          local_68 = lcIconLoader::category.name;
          QMessageLogger::debug();
          uVar6 = local_48._0_8_;
          QVar21.m_data = (storage_type *)0x21;
          QVar21.m_size = (qsizetype)local_60;
          QString::fromUtf8(QVar21);
          QTextStream::operator<<((QTextStream *)uVar6,(QString *)local_60);
          if (local_60[0] != (QArrayData *)0x0) {
            LOCK();
            (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_60[0],2,0x10);
            }
          }
          if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
          }
          QDebug::~QDebug((QDebug *)local_48);
        }
        goto LAB_0027c64f;
      }
      (*(pQVar13->super_QIconEngine)._vptr_QIconEngine[1])(pQVar13);
    }
  }
  pQVar13 = this_01;
  if (this_01 == (QFontIconEngine *)0x0) {
    pQVar13 = (QFontIconEngine *)operator_new(0x50);
    QIconLoaderEngine::QIconLoaderEngine((QIconLoaderEngine *)pQVar13,iconName);
  }
LAB_0027c64f:
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_80.d._0_4_ = 2;
    local_80.d._4_4_ = 0;
    local_80.ptr._0_4_ = 0;
    local_80.ptr._4_4_ = 0;
    local_80.size._0_4_ = 0;
    local_80.size._4_4_ = 0;
    local_68 = lcIconLoader::category.name;
    QMessageLogger::debug();
    uVar6 = local_48._0_8_;
    QVar22.m_data = &DAT_00000010;
    QVar22.m_size = (qsizetype)local_60;
    QString::fromUtf8(QVar22);
    QTextStream::operator<<((QTextStream *)uVar6,(QString *)local_60);
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_48._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
    local_98._vptr_QIconEngine = (_func_int **)local_48._0_8_;
    *(int *)(local_48._0_8_ + 0x28) = *(int *)(local_48._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)local_90,&local_98);
    QDebug::~QDebug((QDebug *)local_90);
    QDebug::~QDebug((QDebug *)&local_98);
    QDebug::~QDebug((QDebug *)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return &pQVar13->super_QIconEngine;
}

Assistant:

QIconEngine *QIconLoader::iconEngine(const QString &iconName) const
{
    qCDebug(lcIconLoader) << "Resolving icon engine for icon" << iconName;

    std::unique_ptr<QIconEngine> iconEngine;

    if (!m_factory) {
        qCDebug(lcIconLoader) << "Finding a plugin for theme" << themeName();
        // try to find a plugin that supports the current theme
        const int factoryIndex = qt_iconEngineFactoryLoader()->indexOf(themeName());
        if (factoryIndex >= 0)
            m_factory = qobject_cast<QIconEnginePlugin *>(qt_iconEngineFactoryLoader()->instance(factoryIndex));
    }
    if (m_factory && *m_factory)
        iconEngine.reset(m_factory.value()->create(iconName));

    if (hasUserTheme()) {
        if (!iconEngine || iconEngine->isNull()) {
            if (QFontDatabase::families().contains(themeName())) {
                QFont maybeIconFont(themeName());
                maybeIconFont.setStyleStrategy(QFont::NoFontMerging);
                qCDebug(lcIconLoader) << "Trying font icon engine.";
                iconEngine.reset(new QFontIconEngine(iconName, maybeIconFont));
            }
        }
        if (!iconEngine || iconEngine->isNull()) {
            qCDebug(lcIconLoader) << "Trying loader engine for theme.";
            iconEngine.reset(new QIconLoaderEngine(iconName));
        }
    }

    if (!iconEngine || iconEngine->isNull()) {
        qCDebug(lcIconLoader) << "Icon is not available from theme or fallback theme.";
        if (auto *platformTheme = QGuiApplicationPrivate::platformTheme()) {
            qCDebug(lcIconLoader) << "Trying platform engine.";
            std::unique_ptr<QIconEngine> themeEngine(platformTheme->createIconEngine(iconName));
            if (themeEngine && !themeEngine->isNull()) {
                iconEngine = std::move(themeEngine);
                qCDebug(lcIconLoader) << "Icon provided by platform engine.";
            }
        }
    }
    // We need to maintain the invariant that the QIcon has a valid engine
    if (!iconEngine)
        iconEngine.reset(new QIconLoaderEngine(iconName));

    qCDebug(lcIconLoader) << "Resulting engine" << iconEngine.get();
    return iconEngine.release();
}